

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O1

int parse_ptl(GetBitContext *gb,PTL *ptl,int max_num_sub_layers)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t re_size_plus8;
  PTLCommon *ptl_00;
  char *__format;
  uint8_t *puVar7;
  long lVar8;
  
  iVar3 = decode_profile_tier_level(gb,&ptl->general_ptl);
  if ((iVar3 < 0) ||
     (uVar5 = gb->index,
     (int)(gb->size_in_bits - uVar5) < (int)((uint)(1 < max_num_sub_layers) << 4 | 8))) {
    parse_ptl_cold_1();
LAB_00104c99:
    iVar3 = -1;
  }
  else {
    uVar2 = *(uint *)(gb->buffer + (uVar5 >> 3));
    uVar4 = uVar5 + 8;
    if (gb->size_in_bits_plus8 < uVar5 + 8) {
      uVar4 = gb->size_in_bits_plus8;
    }
    gb->index = uVar4;
    (ptl->general_ptl).level_idc =
         (uint8_t)(((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    ) << ((byte)uVar5 & 7)) >> 0x18);
    if (1 < max_num_sub_layers) {
      uVar6 = 0;
      do {
        uVar5 = gb->index;
        uVar1 = gb->buffer[uVar5 >> 3];
        gb->index = uVar5 + (uVar5 < gb->size_in_bits_plus8);
        ptl->sub_layer_profile_present_flag[uVar6] = (byte)(uVar1 << ((byte)uVar5 & 7)) >> 7;
        uVar5 = gb->index;
        uVar1 = gb->buffer[uVar5 >> 3];
        gb->index = uVar5 + (uVar5 < gb->size_in_bits_plus8);
        ptl->sub_layer_level_present_flag[uVar6] = (byte)(uVar1 << ((byte)uVar5 & 7)) >> 7;
        uVar6 = uVar6 + 1;
      } while (max_num_sub_layers - 1 != uVar6);
    }
    if (max_num_sub_layers - 2U < 7) {
      uVar5 = gb->index;
      iVar3 = max_num_sub_layers + -9;
      do {
        uVar5 = uVar5 + 2;
        if (gb->size_in_bits_plus8 < uVar5) {
          uVar5 = gb->size_in_bits_plus8;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0);
      gb->index = uVar5;
    }
    if (1 < max_num_sub_layers) {
      puVar7 = ptl->sub_layer_profile_present_flag;
      ptl_00 = ptl->sub_layer_ptl;
      lVar8 = 0;
      do {
        if (*puVar7 != '\0') {
          iVar3 = decode_profile_tier_level(gb,ptl_00);
          if (-1 < iVar3) goto LAB_00104bfe;
          __format = "PTL information for sublayer %i too short\n";
LAB_00104c8f:
          fprintf(_stderr,__format,(ulong)(uint)-(int)lVar8);
          goto LAB_00104c99;
        }
LAB_00104bfe:
        if (puVar7[7] != '\0') {
          uVar5 = gb->index;
          if ((int)(gb->size_in_bits - uVar5) < 8) {
            __format = "Not enough data for sublayer %i level_idc\n";
            goto LAB_00104c8f;
          }
          uVar2 = *(uint *)(gb->buffer + (uVar5 >> 3));
          uVar4 = uVar5 + 8;
          if (gb->size_in_bits_plus8 < uVar5 + 8) {
            uVar4 = gb->size_in_bits_plus8;
          }
          gb->index = uVar4;
          ptl_00->level_idc =
               (uint8_t)(((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18) << ((byte)uVar5 & 7)) >> 0x18);
        }
        lVar8 = lVar8 + -1;
        puVar7 = puVar7 + 1;
        ptl_00 = ptl_00 + 1;
      } while (-lVar8 != (ulong)(max_num_sub_layers - 1));
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int parse_ptl(GetBitContext *gb, PTL *ptl, int max_num_sub_layers)
{
    int i;
    if (decode_profile_tier_level(gb, &ptl->general_ptl) < 0 || get_bits_left(gb) < 8 + (8 * 2 * (max_num_sub_layers - 1 > 0))) {
        fprintf(stderr, "PTL information too short\n");
        return -1;
    }

    ptl->general_ptl.level_idc = (uint8_t)get_bits(gb, 8);

    for (i = 0; i < max_num_sub_layers - 1; i++)
    {
        ptl->sub_layer_profile_present_flag[i] = (uint8_t)get_bits1(gb);
        ptl->sub_layer_level_present_flag[i]   = (uint8_t)get_bits1(gb);
    }

    if (max_num_sub_layers > 1)
        for (i = max_num_sub_layers - 1; i < 8; i++)
            skip_bits(gb, 2); // reserved_zero_2bits[i]
    for (i = 0; i < max_num_sub_layers - 1; i++)
    {
        if (ptl->sub_layer_profile_present_flag[i] && decode_profile_tier_level(gb, &ptl->sub_layer_ptl[i]) < 0)
        {
            fprintf(stderr, "PTL information for sublayer %i too short\n", i);
            return -1;
        }
        if (ptl->sub_layer_level_present_flag[i])
        {
            if (get_bits_left(gb) < 8)
            {
                fprintf(stderr, "Not enough data for sublayer %i level_idc\n", i);
                return -1;
            }
            else
                ptl->sub_layer_ptl[i].level_idc = (uint8_t)get_bits(gb, 8);
        }
    }

    return 0;
}